

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cmd.h
# Opt level: O1

void __thiscall Cmd::loadHistory(Cmd *this)

{
  char cVar1;
  istream *piVar2;
  string line;
  ifstream file;
  string local_248;
  long local_228 [65];
  
  if ((this->history_file_).
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    std::ifstream::ifstream((istream *)local_228,(string *)&this->history_file_,_S_in);
    local_248._M_string_length = 0;
    local_248.field_2._M_local_buf[0] = '\0';
    local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
    while( true ) {
      cVar1 = std::ios::widen((char)*(undefined8 *)(local_228[0] + -0x18) +
                              (char)(istream *)local_228);
      piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_228,(string *)&local_248,cVar1);
      if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
      addHistoryEntry(this,&local_248);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,
                      CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                               local_248.field_2._M_local_buf[0]) + 1);
    }
    std::ifstream::~ifstream(local_228);
  }
  return;
}

Assistant:

void loadHistory() {
		if (history_file_) {
			std::ifstream file(*history_file_);
			for (std::string line; std::getline(file, line);) {
				addHistoryEntry(line);
			}
		}
	}